

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O1

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x2,coord_type y2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int y1;
  uint uVar4;
  coord_type x1;
  int x1_00;
  int iVar5;
  uint uVar6;
  uint f2;
  int iVar7;
  coord_type cVar8;
  bool bVar9;
  ulong uVar10;
  double dVar11;
  uint f1;
  
  if (this->m_clipping != true) {
    rasterizer_cells_aa<agg::cell_aa>::line(ras,this->m_x1,this->m_y1,x2,y2);
    goto LAB_00110457;
  }
  iVar7 = (this->m_clip_box).x2;
  iVar1 = (this->m_clip_box).y2;
  x1_00 = (this->m_clip_box).x1;
  iVar2 = (this->m_clip_box).y1;
  uVar3 = (uint)(iVar7 < x2) + (uint)(iVar1 < y2) * 2 + (uint)(x2 < x1_00) * 4;
  f2 = uVar3 + (uint)(y2 < iVar2) * 8;
  f1 = this->m_f1;
  uVar4 = f1 & 10;
  bVar9 = uVar4 == (f2 & 0xfffffffa);
  if (uVar4 != 0 && bVar9) {
    this->m_x1 = x2;
    this->m_y1 = y2;
    goto switchD_0010ff7c_caseD_5;
  }
  uVar3 = (uVar3 & 0xfffffffd) + (f1 & 5) * 2;
  if (0xc < uVar3) goto switchD_0010ff7c_caseD_5;
  x1 = this->m_x1;
  y1 = this->m_y1;
  switch(uVar3) {
  case 0:
    x1_00 = x2;
    break;
  case 1:
    dVar11 = ((double)(y2 - y1) * (double)(iVar7 - x1)) / (double)(x2 - x1);
    cVar8 = (int)(dVar11 + *(double *)(&DAT_001128f0 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < cVar8) * 2 + (uint)(cVar8 < iVar2) * 8;
    goto LAB_0011036a;
  case 2:
    dVar11 = ((double)(y2 - y1) * (double)(iVar7 - x1)) / (double)(x2 - x1);
    iVar5 = (int)(dVar11 + *(double *)(&DAT_001128f0 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < iVar5) * 2 + (uint)(iVar5 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar7,y1,iVar7,iVar5,f1,uVar3);
    x1_00 = x2;
    x1 = (this->m_clip_box).x2;
    y1 = iVar5;
    f1 = uVar3;
    break;
  case 3:
    x1_00 = iVar7;
    x1 = iVar7;
    break;
  case 4:
    dVar11 = ((double)(y2 - y1) * (double)(x1_00 - x1)) / (double)(x2 - x1);
    cVar8 = (int)(dVar11 + *(double *)(&DAT_001128f0 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < cVar8) * 2 + (uint)(cVar8 < iVar2) * 8;
    goto LAB_0011040b;
  default:
    goto switchD_0010ff7c_caseD_5;
  case 6:
    dVar11 = ((double)(iVar7 - x1) * (double)(y2 - y1)) / (double)(x2 - x1);
    uVar10 = -(ulong)(dVar11 < 0.0);
    iVar5 = (int)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) + dVar11) +
            y1;
    dVar11 = ((double)(x1_00 - x1) * (double)(y2 - y1)) / (double)(x2 - x1);
    uVar10 = -(ulong)(dVar11 < 0.0);
    cVar8 = (int)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) + dVar11) +
            y1;
    uVar6 = (uint)(iVar1 < iVar5) * 2 + (uint)(iVar5 < iVar2) * 8;
    uVar3 = (uint)(iVar1 < cVar8) * 2 + (uint)(cVar8 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar7,y1,iVar7,iVar5,f1,uVar6);
    x1_00 = (this->m_clip_box).x1;
    x1 = (this->m_clip_box).x2;
    y1 = iVar5;
    f1 = uVar6;
LAB_0011040b:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,x1_00,cVar8,f1,uVar3);
    x1_00 = (this->m_clip_box).x1;
    x1 = x1_00;
    y1 = cVar8;
    f1 = uVar3;
    break;
  case 8:
    dVar11 = ((double)(y2 - y1) * (double)(x1_00 - x1)) / (double)(x2 - x1);
    iVar7 = (int)(dVar11 + *(double *)(&DAT_001128f0 + (ulong)(dVar11 < 0.0) * 8)) + y1;
    uVar3 = (uint)(iVar1 < iVar7) * 2 + (uint)(iVar7 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1_00,y1,x1_00,iVar7,f1,uVar3);
    x1_00 = x2;
    x1 = (this->m_clip_box).x1;
    y1 = iVar7;
    f1 = uVar3;
    break;
  case 9:
    dVar11 = ((double)(x1_00 - x1) * (double)(y2 - y1)) / (double)(x2 - x1);
    uVar10 = -(ulong)(dVar11 < 0.0);
    iVar5 = (int)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) + dVar11) +
            y1;
    dVar11 = ((double)(iVar7 - x1) * (double)(y2 - y1)) / (double)(x2 - x1);
    uVar10 = -(ulong)(dVar11 < 0.0);
    cVar8 = (int)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) + dVar11) +
            y1;
    uVar6 = (uint)(iVar1 < iVar5) * 2 + (uint)(iVar5 < iVar2) * 8;
    uVar3 = (uint)(iVar1 < cVar8) * 2 + (uint)(cVar8 < iVar2) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1_00,y1,x1_00,iVar5,f1,uVar6);
    x1 = (this->m_clip_box).x1;
    iVar7 = (this->m_clip_box).x2;
    y1 = iVar5;
    f1 = uVar6;
LAB_0011036a:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,iVar7,cVar8,f1,uVar3);
    x1_00 = (this->m_clip_box).x2;
    x1 = x1_00;
    y1 = cVar8;
    f1 = uVar3;
    break;
  case 0xc:
    x1 = x1_00;
  }
  line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,x1_00,y2,f1,f2);
switchD_0010ff7c_caseD_5:
  this->m_f1 = f2;
  if (uVar4 == 0 || !bVar9) {
LAB_00110457:
    this->m_x1 = x2;
    this->m_y1 = y2;
  }
  return;
}

Assistant:

void line_to(Rasterizer& ras, coord_type x2, coord_type y2)
        {
            if(m_clipping)
            {
                unsigned f2 = clipping_flags(x2, y2, m_clip_box);

                if((m_f1 & 10) == (f2 & 10) && (m_f1 & 10) != 0)
                {
                    // Invisible by Y
                    m_x1 = x2;
                    m_y1 = y2;
                    m_f1 = f2;
                    return;
                }

                coord_type x1 = m_x1;
                coord_type y1 = m_y1;
                unsigned   f1 = m_f1;
                coord_type y3, y4;
                unsigned   f3, f4;

                switch(((f1 & 5) << 1) | (f2 & 5))
                {
                case 0: // Visible by X
                    line_clip_y(ras, x1, y1, x2, y2, f1, f2);
                    break;

                case 1: // x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x2, y2, f3, f2);
                    break;

                case 2: // x1 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, x2, y2, f3, f2);
                    break;

                case 3: // x1 > clip.x2 && x2 > clip.x2
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y2, f1, f2);
                    break;

                case 4: // x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x1, y2, f3, f2);
                    break;

                case 6: // x1 > clip.x2 && x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x1, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x1, y4, m_clip_box.x1, y2, f4, f2);
                    break;

                case 8: // x1 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, x2, y2, f3, f2);
                    break;

                case 9:  // x1 < clip.x1 && x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x2, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x2, y4, m_clip_box.x2, y2, f4, f2);
                    break;

                case 12: // x1 < clip.x1 && x2 < clip.x1
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y2, f1, f2);
                    break;
                }
                m_f1 = f2;
            }
            else
            {
                ras.line(Conv::xi(m_x1), Conv::yi(m_y1), 
                         Conv::xi(x2),   Conv::yi(y2)); 
            }
            m_x1 = x2;
            m_y1 = y2;
        }